

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

bool __thiscall HighFreqDataType::operator<(HighFreqDataType *this,HighFreqDataType *obj)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = std::operator>(&this->name,&obj->name);
  bVar2 = std::operator>(&this->origin,&obj->origin);
  return !bVar2 && !bVar1;
}

Assistant:

bool HighFreqDataType::operator <(const HighFreqDataType obj) const {
    bool retval = true;
    if (name > obj.name)
        retval = false;
    if (origin > obj.origin)
        retval = false;

    return(retval);
}